

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void load_balancing(void)

{
  ostream *poVar1;
  double dVar2;
  bool need_to_balance;
  double local_80;
  vector<int,_std::allocator<int>_> new_partition;
  vector<double,_std::allocator<double>_> global_weights;
  vector<int,_std::allocator<int>_> optimal_partition;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  need_to_balance = false;
  calculate_global_layer_weights();
  if (mpi_rank == 0) {
    local_80 = calculate_partition_imbalance(&global_weights,&x0_sr,nx_ich);
    need_to_balance = balancing_threshold < local_80;
  }
  MPI_Bcast(&need_to_balance,1,&ompi_mpi_cxx_bool,0,&ompi_mpi_comm_world);
  if (need_to_balance == true) {
    std::vector<int,_std::allocator<int>_>::vector
              (&new_partition,(long)n_sr,(allocator_type *)&optimal_partition);
    if (mpi_rank == 0) {
      calculate_optimal_partition(&optimal_partition,&global_weights,n_sr,nx_ich);
      normalize_new_partition
                ((vector<int,_std::allocator<int>_> *)&local_28,&x0_sr,&optimal_partition,nx_ich);
      std::vector<int,_std::allocator<int>_>::_M_move_assign(&new_partition,&local_28);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
      dVar2 = calculate_partition_imbalance(&global_weights,&new_partition,nx_ich);
      std::operator<<((ostream *)&std::cout,"Load balancing: imbalance ");
      poVar1 = std::ostream::_M_insert<double>(local_80);
      std::operator<<(poVar1,", after balancing ");
      poVar1 = std::ostream::_M_insert<double>(dVar2);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&optimal_partition.super__Vector_base<int,_std::allocator<int>_>);
    }
    MPI_Bcast(new_partition.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start,
              (ulong)((long)new_partition.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)new_partition.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2,&ompi_mpi_int,0,
              &ompi_mpi_comm_world);
    resize_regions(&new_partition);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&new_partition.super__Vector_base<int,_std::allocator<int>_>);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&global_weights.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void load_balancing() {
    bool need_to_balance = false;
    
    auto global_weights = calculate_global_layer_weights();
    
    double initial_imbalance;
    if (mpi_rank == 0) {
        initial_imbalance = calculate_partition_imbalance(global_weights, x0_sr, nx_ich);

        need_to_balance = (initial_imbalance > balancing_threshold);
    }

    MPI_Bcast(&need_to_balance, 1, MPI_CXX_BOOL, 0, MPI_COMM_WORLD);

    if (need_to_balance) {
        std::vector<int> new_partition(n_sr);

        if (mpi_rank == 0) {
            auto optimal_partition = calculate_optimal_partition(global_weights, n_sr, nx_ich);
            new_partition = normalize_new_partition(x0_sr, optimal_partition, nx_ich);
            auto normalized_imbalance = calculate_partition_imbalance(global_weights, new_partition, nx_ich);

            cout << "Load balancing: imbalance " << initial_imbalance << ", after balancing " << normalized_imbalance << endl;
        }

        MPI_Bcast(new_partition.data(), new_partition.size(), MPI_INT, 0, MPI_COMM_WORLD);

        resize_regions(new_partition);
    }
}